

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool tdefl_compress_block(tdefl_compressor *d,mz_bool static_block)

{
  mz_uint16 (*pamVar1) [288];
  mz_uint16 *pmVar2;
  mz_uint16 *pmVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  mz_uint8 *pmVar8;
  uint uVar9;
  mz_uint8 (*pamVar10) [288];
  mz_uint16 (*pamVar11) [288];
  uint uVar12;
  long lVar13;
  undefined1 *puVar14;
  mz_uint16 *pmVar15;
  byte *pbVar16;
  int iVar17;
  byte *pbVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  mz_uint8 *pmVar24;
  char cVar25;
  ulong uVar27;
  char cVar28;
  byte bVar29;
  uint uVar30;
  int iVar31;
  int iVar32;
  uint uVar33;
  ulong uVar34;
  mz_uint mVar35;
  bool bVar36;
  byte abStack_2b8 [320];
  mz_uint8 code_sizes_to_pack [320];
  short sVar26;
  
  if (static_block == 0) {
    d->m_huff_count[0][0x100] = 1;
    tdefl_optimize_huffman_table(d,0,0x120,0xf,0);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,0);
    iVar17 = 0x11f;
    lVar13 = 0x9067;
    do {
      if (lVar13 - 0x8f49U < 0x102) {
        iVar17 = 0x101;
        break;
      }
      iVar17 = iVar17 + -1;
      lVar19 = lVar13 + -0x14;
      lVar13 = lVar13 + -1;
    } while (*(char *)((long)d->m_max_probes + lVar19) == '\0');
    lVar13 = 36999;
    iVar32 = 0x1f;
    do {
      iVar31 = 1;
      if (lVar13 - 0x9069U < 2) break;
      iVar31 = iVar32 + -1;
      lVar19 = lVar13 + -0x14;
      lVar13 = lVar13 + -1;
      iVar32 = iVar31;
    } while (*(char *)((long)d->m_max_probes + lVar19) == '\0');
    memcpy(code_sizes_to_pack,d->m_huff_code_sizes,(long)iVar17);
    memcpy(code_sizes_to_pack + iVar17,d->m_huff_code_sizes + 1,(long)iVar31);
    pamVar1 = d->m_huff_count + 2;
    pamVar11 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x10) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x12) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x14) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x16) = 0;
    pamVar11 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x18) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x1a) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x1c) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x1e) = 0;
    pamVar11 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x1e) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x20) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x22) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0x24) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 0) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 2) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 4) = 0;
    *(mz_uint16 *)((long)(d->m_huff_count + 2) + 6) = 0;
    pamVar11 = d->m_huff_count;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 8) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 10) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0xc) = 0;
    *(mz_uint16 *)((long)(pamVar11 + 2) + 0xe) = 0;
    pmVar2 = d->m_huff_count[2] + 0x12;
    pmVar3 = d->m_huff_count[2] + 0x11;
    uVar21 = 0;
    uVar30 = 0;
    uVar12 = 0;
    uVar27 = 0;
    uVar23 = 0xff;
    while( true ) {
      bVar29 = (byte)uVar23;
      uVar33 = (uint)uVar27;
      cVar28 = (char)uVar12;
      cVar25 = (char)uVar30;
      sVar26 = (short)uVar30;
      if (uVar21 == (uint)(iVar31 + iVar17)) break;
      bVar4 = code_sizes_to_pack[uVar21];
      uVar22 = (ulong)bVar4;
      if (uVar22 == 0) {
        if (uVar30 != 0) {
          if (uVar30 < 3) {
            (*pamVar1)[uVar23] = (*pamVar1)[uVar23] + sVar26;
            while (bVar36 = uVar30 != 0, uVar30 = uVar30 - 1, bVar36) {
              abStack_2b8[uVar27] = bVar29;
              uVar27 = (ulong)((int)uVar27 + 1);
            }
          }
          else {
            pmVar15 = d->m_huff_count[2] + 0x10;
            *pmVar15 = *pmVar15 + 1;
            abStack_2b8[uVar27] = 0x10;
            uVar27 = (ulong)(uVar33 + 2);
            abStack_2b8[uVar33 + 1] = cVar25 - 3;
          }
        }
        uVar12 = uVar12 + 1;
        if (uVar12 == 0x8a) {
          *pmVar2 = *pmVar2 + 1;
          iVar32 = (int)uVar27;
          abStack_2b8[uVar27] = 0x12;
          uVar27 = (ulong)(iVar32 + 2);
          abStack_2b8[iVar32 + 1] = 0x7f;
          goto LAB_003a3fcb;
        }
        uVar30 = 0;
      }
      else {
        uVar34 = uVar27;
        if (uVar12 != 0) {
          if (uVar12 < 3) {
            (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar12;
            while (bVar36 = uVar12 != 0, uVar12 = uVar12 - 1, bVar36) {
              abStack_2b8[uVar34] = 0;
              uVar34 = (ulong)((int)uVar34 + 1);
            }
          }
          else {
            uVar34 = (ulong)(uVar33 + 2);
            bVar36 = uVar12 < 0xb;
            pmVar15 = pmVar2;
            if (bVar36) {
              pmVar15 = pmVar3;
            }
            *pmVar15 = *pmVar15 + 1;
            abStack_2b8[uVar27] = 0x12 - bVar36;
            abStack_2b8[uVar33 + 1] = (bVar36 * '\b' + cVar28) - 0xb;
          }
        }
        iVar32 = (int)uVar34;
        if (bVar4 == bVar29) {
          uVar30 = uVar30 + 1;
          uVar27 = uVar34;
          if (uVar30 == 6) {
            pmVar15 = d->m_huff_count[2] + 0x10;
            *pmVar15 = *pmVar15 + 1;
            abStack_2b8[uVar34] = 0x10;
            abStack_2b8[iVar32 + 1] = 3;
            uVar27 = (ulong)(iVar32 + 2);
            goto LAB_003a3fcb;
          }
        }
        else {
          if (uVar30 != 0) {
            if (uVar30 < 3) {
              (*pamVar1)[uVar23] = (*pamVar1)[uVar23] + sVar26;
              while (bVar36 = uVar30 != 0, uVar30 = uVar30 - 1, bVar36) {
                abStack_2b8[uVar34] = bVar29;
                uVar34 = (ulong)((int)uVar34 + 1);
              }
            }
            else {
              pmVar15 = d->m_huff_count[2] + 0x10;
              *pmVar15 = *pmVar15 + 1;
              abStack_2b8[uVar34] = 0x10;
              uVar34 = (ulong)(iVar32 + 2);
              abStack_2b8[iVar32 + 1] = cVar25 - 3;
            }
          }
          (*pamVar1)[uVar22] = (*pamVar1)[uVar22] + 1;
          uVar27 = (ulong)((int)uVar34 + 1);
          abStack_2b8[uVar34] = bVar4;
LAB_003a3fcb:
          uVar30 = 0;
        }
        uVar12 = 0;
      }
      uVar21 = uVar21 + 1;
      uVar23 = uVar22;
    }
    if (uVar30 == 0) {
      if (uVar12 != 0) {
        if (uVar12 < 3) {
          (*pamVar1)[0] = (*pamVar1)[0] + (short)uVar12;
          while( true ) {
            uVar33 = (uint)uVar27;
            bVar36 = uVar12 == 0;
            uVar12 = uVar12 - 1;
            if (bVar36) break;
            abStack_2b8[uVar27] = 0;
            uVar27 = (ulong)(uVar33 + 1);
          }
        }
        else {
          uVar30 = uVar33 + 1;
          uVar33 = uVar33 + 2;
          if (uVar12 < 0xb) {
            *pmVar3 = *pmVar3 + 1;
            abStack_2b8[uVar27] = 0x11;
            bVar29 = cVar28 - 3;
          }
          else {
            *pmVar2 = *pmVar2 + 1;
            abStack_2b8[uVar27] = 0x12;
            bVar29 = cVar28 - 0xb;
          }
          abStack_2b8[uVar30] = bVar29;
        }
      }
    }
    else if (uVar30 < 3) {
      (*pamVar1)[uVar23] = (*pamVar1)[uVar23] + sVar26;
      while( true ) {
        uVar33 = (uint)uVar27;
        bVar36 = uVar30 == 0;
        uVar30 = uVar30 - 1;
        if (bVar36) break;
        abStack_2b8[uVar27] = bVar29;
        uVar27 = (ulong)(uVar33 + 1);
      }
    }
    else {
      pmVar2 = d->m_huff_count[2] + 0x10;
      *pmVar2 = *pmVar2 + 1;
      uVar30 = uVar33 + 1;
      abStack_2b8[uVar27] = 0x10;
      uVar33 = uVar33 + 2;
      abStack_2b8[uVar30] = cVar25 - 3;
    }
    tdefl_optimize_huffman_table(d,2,0x13,7,0);
    uVar30 = 2 << ((byte)d->m_bits_in & 0x1f) | d->m_bit_buffer;
    d->m_bit_buffer = uVar30;
    for (uVar12 = d->m_bits_in + 2; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
      pmVar24 = d->m_pOutput_buf;
      if (pmVar24 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar24 + 1;
        *pmVar24 = (mz_uint8)uVar30;
        uVar12 = d->m_bits_in;
        uVar30 = d->m_bit_buffer;
      }
      uVar30 = uVar30 >> 8;
      d->m_bit_buffer = uVar30;
    }
    if (0x1f < iVar17 - 0x101U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                    ,0xb68,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    mVar35 = iVar17 - 0x101U << ((byte)uVar12 & 0x1f) | uVar30;
    d->m_bit_buffer = mVar35;
    for (uVar12 = uVar12 + 5; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
      pmVar24 = d->m_pOutput_buf;
      if (pmVar24 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar24 + 1;
        *pmVar24 = (mz_uint8)mVar35;
        uVar12 = d->m_bits_in;
        mVar35 = d->m_bit_buffer;
      }
      mVar35 = mVar35 >> 8;
      d->m_bit_buffer = mVar35;
    }
    if (0x1f < iVar31 - 1U) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                    ,0xb69,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    mVar35 = iVar31 - 1U << ((byte)uVar12 & 0x1f) | mVar35;
    d->m_bit_buffer = mVar35;
    for (uVar12 = uVar12 + 5; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
      pmVar24 = d->m_pOutput_buf;
      if (pmVar24 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar24 + 1;
        *pmVar24 = (mz_uint8)mVar35;
        uVar12 = d->m_bits_in;
        mVar35 = d->m_bit_buffer;
      }
      mVar35 = mVar35 >> 8;
      d->m_bit_buffer = mVar35;
    }
    uVar30 = 0x12;
    while ((uVar20 = 0xffffffff, -1 < (int)uVar30 &&
           (uVar20 = uVar30, d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar30]] == '\0'))) {
      uVar30 = uVar30 - 1;
    }
    if ((int)uVar20 < 4) {
      uVar20 = 3;
    }
    if (0xf < uVar20 - 3) {
      __assert_fail("bits <= ((1U << len) - 1U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                    ,0xb70,"void tdefl_start_dynamic_block(tdefl_compressor *)");
    }
    uVar20 = uVar20 - 3 << ((byte)uVar12 & 0x1f) | mVar35;
    d->m_bit_buffer = uVar20;
    for (uVar12 = uVar12 + 4; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
      pmVar24 = d->m_pOutput_buf;
      if (pmVar24 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar24 + 1;
        *pmVar24 = (mz_uint8)uVar20;
        uVar12 = d->m_bits_in;
        uVar20 = d->m_bit_buffer;
      }
      uVar20 = uVar20 >> 8;
      d->m_bit_buffer = uVar20;
    }
    uVar9 = 3;
    if (3 < (int)uVar30) {
      uVar9 = uVar30;
    }
    for (uVar23 = 0; uVar23 != uVar9 + 1; uVar23 = uVar23 + 1) {
      uVar30 = (uint)d->m_huff_code_sizes[2]["\x10\x11\x12"[uVar23]];
      if (7 < uVar30) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xb73,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      uVar20 = uVar20 | uVar30 << ((byte)uVar12 & 0x1f);
      d->m_bit_buffer = uVar20;
      for (uVar12 = uVar12 + 3; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
        pmVar24 = d->m_pOutput_buf;
        if (pmVar24 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar24 + 1;
          *pmVar24 = (mz_uint8)uVar20;
          uVar12 = d->m_bits_in;
          uVar20 = d->m_bit_buffer;
        }
        uVar20 = uVar20 >> 8;
        d->m_bit_buffer = uVar20;
      }
    }
    uVar23 = 0;
    while (uVar30 = (uint)uVar23, uVar30 < uVar33) {
      uVar27 = uVar23 & 0xffffffff;
      bVar29 = abStack_2b8[uVar27];
      uVar23 = (ulong)bVar29;
      if (0x12 < uVar23) {
        __assert_fail("code < TDEFL_MAX_HUFF_SYMBOLS_2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xb78,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      uVar7 = d->m_huff_codes[2][uVar23];
      bVar4 = d->m_huff_code_sizes[2][uVar23];
      if (uVar7 >> (bVar4 & 0x1f) != 0) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xb79,"void tdefl_start_dynamic_block(tdefl_compressor *)");
      }
      uVar23 = uVar27 + 1;
      uVar20 = uVar20 | (uint)uVar7 << ((byte)uVar12 & 0x1f);
      d->m_bit_buffer = uVar20;
      for (uVar12 = uVar12 + bVar4; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
        pmVar24 = d->m_pOutput_buf;
        if (pmVar24 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar24 + 1;
          *pmVar24 = (mz_uint8)uVar20;
          uVar12 = d->m_bits_in;
          uVar20 = d->m_bit_buffer;
        }
        uVar20 = uVar20 >> 8;
        d->m_bit_buffer = uVar20;
      }
      if (0xf < bVar29) {
        bVar29 = "\x02\x03\a"[bVar29 - 0x10];
        if (abStack_2b8[uVar27 + 1] >> (bVar29 & 0x1f) != 0) {
          __assert_fail("bits <= ((1U << len) - 1U)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                        ,0xb7c,"void tdefl_start_dynamic_block(tdefl_compressor *)");
        }
        uVar20 = uVar20 | (uint)abStack_2b8[uVar27 + 1] << ((byte)uVar12 & 0x1f);
        d->m_bit_buffer = uVar20;
        for (uVar12 = uVar12 + (int)(char)bVar29; d->m_bits_in = uVar12, 7 < uVar12;
            uVar12 = uVar12 - 8) {
          pmVar24 = d->m_pOutput_buf;
          if (pmVar24 < d->m_pOutput_buf_end) {
            d->m_pOutput_buf = pmVar24 + 1;
            *pmVar24 = (mz_uint8)uVar20;
            uVar12 = d->m_bits_in;
            uVar20 = d->m_bit_buffer;
          }
          uVar20 = uVar20 >> 8;
          d->m_bit_buffer = uVar20;
        }
        uVar23 = (ulong)(uVar30 + 2);
      }
    }
  }
  else {
    for (lVar13 = 0x8f4a; (int)lVar13 != 0x8fda; lVar13 = lVar13 + 1) {
      *(undefined1 *)((long)d->m_max_probes + lVar13 + -0x14) = 8;
    }
    puVar14 = (undefined1 *)((long)d->m_max_probes + lVar13 + -0x14);
    for (iVar17 = 0x90; iVar17 != 0x100; iVar17 = iVar17 + 1) {
      *puVar14 = 9;
      puVar14 = puVar14 + 1;
    }
    for (lVar13 = 0; (int)lVar13 != 0x18; lVar13 = lVar13 + 1) {
      puVar14[lVar13] = 7;
    }
    for (lVar19 = 0; (int)lVar19 != 8; lVar19 = lVar19 + 1) {
      puVar14[lVar13 + lVar19] = 8;
    }
    pamVar10 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x10) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x11) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x12) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x13) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x14) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x15) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x16) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x17) = '\x05';
    pamVar10 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x18) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x19) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x1a) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x1b) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x1c) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x1d) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x1e) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0x1f) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 0) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 1) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 2) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 3) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 4) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 5) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 6) = '\x05';
    *(mz_uint8 *)((long)(d->m_huff_code_sizes + 1) + 7) = '\x05';
    pamVar10 = d->m_huff_code_sizes;
    *(mz_uint8 *)((long)(pamVar10 + 1) + 8) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 9) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 10) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0xb) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0xc) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0xd) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0xe) = '\x05';
    *(mz_uint8 *)((long)(pamVar10 + 1) + 0xf) = '\x05';
    tdefl_optimize_huffman_table(d,0,0x120,0xf,1);
    tdefl_optimize_huffman_table(d,1,0x20,0xf,1);
    uVar20 = d->m_bit_buffer | 1 << (d->m_bits_in & 0x1f);
    d->m_bit_buffer = uVar20;
    for (uVar12 = d->m_bits_in + 2; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
      pmVar24 = d->m_pOutput_buf;
      if (pmVar24 < d->m_pOutput_buf_end) {
        d->m_pOutput_buf = pmVar24 + 1;
        *pmVar24 = (mz_uint8)uVar20;
        uVar12 = d->m_bits_in;
        uVar20 = d->m_bit_buffer;
      }
      uVar20 = uVar20 >> 8;
      d->m_bit_buffer = uVar20;
    }
  }
  uVar23 = 1;
  pmVar24 = d->m_lz_code_buf;
  do {
    bVar29 = (byte)uVar12;
    if (d->m_pLZ_code_buf <= pmVar24) {
      uVar7 = d->m_huff_codes[0][0x100];
      bVar4 = d->m_huff_code_sizes[0][0x100];
      if (uVar7 >> (bVar4 & 0x1f) != 0) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xc1f,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      uVar20 = uVar20 | (uint)uVar7 << (bVar29 & 0x1f);
      d->m_bit_buffer = uVar20;
      uVar12 = bVar4 + uVar12;
      while( true ) {
        d->m_bits_in = uVar12;
        pmVar24 = d->m_pOutput_buf;
        if (uVar12 < 8) break;
        if (pmVar24 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar24 + 1;
          *pmVar24 = (mz_uint8)uVar20;
          uVar12 = d->m_bits_in;
          uVar20 = d->m_bit_buffer;
        }
        uVar20 = uVar20 >> 8;
        d->m_bit_buffer = uVar20;
        uVar12 = uVar12 - 8;
      }
      return (mz_bool)(pmVar24 < d->m_pOutput_buf_end);
    }
    if ((int)uVar23 == 1) {
      bVar4 = *pmVar24;
      pmVar24 = pmVar24 + 1;
      uVar23 = (ulong)(bVar4 | 0x100);
    }
    if ((uVar23 & 1) == 0) {
      bVar4 = d->m_huff_code_sizes[0][*pmVar24];
      if (bVar4 == 0) {
        __assert_fail("d->m_huff_code_sizes[0][lit]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xc1a,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      uVar7 = d->m_huff_codes[0][*pmVar24];
      if (uVar7 >> (bVar4 & 0x1f) != 0) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xc1b,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      pmVar24 = pmVar24 + 1;
      uVar20 = uVar20 | (uint)uVar7 << (bVar29 & 0x1f);
      d->m_bit_buffer = uVar20;
      for (uVar12 = uVar12 + bVar4; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
        pmVar8 = d->m_pOutput_buf;
        if (pmVar8 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)uVar20;
          uVar12 = d->m_bits_in;
          uVar20 = d->m_bit_buffer;
        }
        uVar20 = uVar20 >> 8;
        d->m_bit_buffer = uVar20;
      }
    }
    else {
      bVar4 = *pmVar24;
      bVar5 = d->m_huff_code_sizes[0][s_tdefl_len_sym[bVar4]];
      if (bVar5 == 0) {
        __assert_fail("d->m_huff_code_sizes[0][s_tdefl_len_sym[match_len]]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xc09,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      uVar7 = d->m_huff_codes[0][s_tdefl_len_sym[bVar4]];
      if (uVar7 >> (bVar5 & 0x1f) != 0) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xc0b,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      bVar6 = pmVar24[2];
      uVar30 = (uint)*(ushort *)(pmVar24 + 1);
      pmVar24 = pmVar24 + 3;
      uVar20 = uVar20 | (uint)uVar7 << (bVar29 & 0x1f);
      d->m_bit_buffer = uVar20;
      for (uVar12 = bVar5 + uVar12; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
        pmVar8 = d->m_pOutput_buf;
        if (pmVar8 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)uVar20;
          uVar12 = d->m_bits_in;
          uVar20 = d->m_bit_buffer;
        }
        uVar20 = uVar20 >> 8;
        d->m_bit_buffer = uVar20;
      }
      bVar29 = ""[bVar4];
      if ((mz_bitmasks[bVar29] & (uint)bVar4) >> (bVar29 & 0x1f) != 0) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xc0d,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      mVar35 = (mz_bitmasks[bVar29] & (uint)bVar4) << ((byte)uVar12 & 0x1f) | uVar20;
      d->m_bit_buffer = mVar35;
      for (uVar12 = bVar29 + uVar12; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
        pmVar8 = d->m_pOutput_buf;
        if (pmVar8 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)mVar35;
          uVar12 = d->m_bits_in;
          mVar35 = d->m_bit_buffer;
        }
        mVar35 = mVar35 >> 8;
        d->m_bit_buffer = mVar35;
      }
      pbVar16 = "" + bVar6;
      if (bVar6 < 2) {
        pbVar16 = "" + uVar30;
      }
      pbVar18 = "" + bVar6;
      if (bVar6 < 2) {
        pbVar18 = "" + uVar30;
      }
      uVar7 = d->m_huff_codes[1][*pbVar18];
      bVar29 = d->m_huff_code_sizes[1][*pbVar18];
      if (uVar7 >> (bVar29 & 0x1f) != 0) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xc16,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      bVar4 = *pbVar16;
      uVar20 = (uint)uVar7 << ((byte)uVar12 & 0x1f) | mVar35;
      d->m_bit_buffer = uVar20;
      for (uVar12 = bVar29 + uVar12; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
        pmVar8 = d->m_pOutput_buf;
        if (pmVar8 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)uVar20;
          uVar12 = d->m_bits_in;
          uVar20 = d->m_bit_buffer;
        }
        uVar20 = uVar20 >> 8;
        d->m_bit_buffer = uVar20;
      }
      if ((uVar30 & mz_bitmasks[bVar4]) >> (bVar4 & 0x1f) != 0) {
        __assert_fail("bits <= ((1U << len) - 1U)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/contrib/zip/src/miniz.h"
                      ,0xc17,"mz_bool tdefl_compress_lz_codes(tdefl_compressor *)");
      }
      uVar20 = (uVar30 & mz_bitmasks[bVar4]) << ((byte)uVar12 & 0x1f) | uVar20;
      d->m_bit_buffer = uVar20;
      for (uVar12 = bVar4 + uVar12; d->m_bits_in = uVar12, 7 < uVar12; uVar12 = uVar12 - 8) {
        pmVar8 = d->m_pOutput_buf;
        if (pmVar8 < d->m_pOutput_buf_end) {
          d->m_pOutput_buf = pmVar8 + 1;
          *pmVar8 = (mz_uint8)uVar20;
          uVar12 = d->m_bits_in;
          uVar20 = d->m_bit_buffer;
        }
        uVar20 = uVar20 >> 8;
        d->m_bit_buffer = uVar20;
      }
    }
    uVar23 = uVar23 >> 1;
  } while( true );
}

Assistant:

static mz_bool tdefl_compress_block(tdefl_compressor *d, mz_bool static_block) {
  if (static_block)
    tdefl_start_static_block(d);
  else
    tdefl_start_dynamic_block(d);
  return tdefl_compress_lz_codes(d);
}